

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

float duckdb::RoundOperatorPrecision::Operation<float,int,float>(float input,int precision)

{
  double dVar1;
  double dVar2;
  
  if (precision < 0) {
    dVar1 = pow(10.0,(double)-(float)precision);
    dVar2 = round((double)input / dVar1);
    dVar2 = dVar2 * dVar1;
    input = 0.0;
  }
  else {
    dVar1 = pow(10.0,(double)precision);
    dVar2 = round((double)input * dVar1);
    dVar2 = dVar2 / dVar1;
  }
  if ((ulong)ABS(dVar2) < 0x7ff0000000000000) {
    input = (float)dVar2;
  }
  return input;
}

Assistant:

static inline TR Operation(TA input, TB precision) {
		double rounded_value;
		if (precision < 0) {
			double modifier = std::pow(10, -TA(precision));
			rounded_value = (std::round(input / modifier)) * modifier;
			if (std::isinf(rounded_value) || std::isnan(rounded_value)) {
				return 0;
			}
		} else {
			double modifier = std::pow(10, TA(precision));
			rounded_value = (std::round(input * modifier)) / modifier;
			if (std::isinf(rounded_value) || std::isnan(rounded_value)) {
				return input;
			}
		}
		return LossyNumericCast<TR>(rounded_value);
	}